

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::BrokenConnection::tryRead
          (BrokenConnection *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  char *pcVar1;
  size_t sVar2;
  _func_int **pp_Var3;
  String local_1d8;
  _func_int **local_1b8;
  Exception local_1b0;
  
  kj::_::Debug::makeDescription<char_const(&)[7]>
            (&local_1d8,(Debug *)"\"broken\"","broken",(char (*) [7])maxBytes);
  Exception::Exception
            (&local_1b0,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
             ,0x1983,&local_1d8);
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
            ((PromiseDisposer *)&local_1b8,&local_1b0);
  pp_Var3 = local_1b8;
  local_1b8 = (_func_int **)0x0;
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = pp_Var3;
  Exception::~Exception(&local_1b0);
  sVar2 = local_1d8.content.size_;
  pcVar1 = local_1d8.content.ptr;
  if (local_1d8.content.ptr != (char *)0x0) {
    local_1d8.content.ptr = (char *)0x0;
    local_1d8.content.size_ = 0;
    (**(local_1d8.content.disposer)->_vptr_ArrayDisposer)
              (local_1d8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    return KJ_EXCEPTION(FAILED, "broken");
  }